

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O3

ostream * flow::diagnostics::operator<<(ostream *os,BufferedReport *report)

{
  pointer pMVar1;
  pointer pMVar2;
  pointer pMVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  long *local_278;
  long local_270;
  long local_268 [2];
  pointer local_258;
  code *local_250;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  pMVar2 = (report->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (report->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar2 != pMVar1) {
    pMVar3 = pMVar2;
    do {
      local_258 = pMVar2;
      if (pMVar3->type == Warning) {
        local_250 = fmt::v5::internal::
                    value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    ::format_custom_arg<flow::diagnostics::Message>;
        local_238 = 0;
        local_248 = &PTR_grow_001934a0;
        local_240 = local_228;
        local_230 = 500;
        format_str.size_ = 0xc;
        format_str.data_ = "Warning: {}\n";
        args.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_258;
        args.types_ = 0xd;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_248,format_str,args);
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,local_240,local_240 + local_238);
        local_248 = &PTR_grow_001934a0;
        if (local_240 != local_228) {
          operator_delete(local_240,local_230);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_278,local_270);
      }
      else {
        local_250 = fmt::v5::internal::
                    value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    ::format_custom_arg<flow::diagnostics::Message>;
        local_238 = 0;
        local_248 = &PTR_grow_001934a0;
        local_240 = local_228;
        local_230 = 500;
        format_str_00.size_ = 10;
        format_str_00.data_ = "Error: {}\n";
        args_00.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_258;
        args_00.types_ = 0xd;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)&local_248,format_str_00,args_00);
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,local_240,local_240 + local_238);
        local_248 = &PTR_grow_001934a0;
        if (local_240 != local_228) {
          operator_delete(local_240,local_230);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_278,local_270);
      }
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      pMVar3 = pMVar3 + 1;
      pMVar2 = pMVar2 + 1;
    } while (pMVar3 != pMVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BufferedReport& report) {
  for (const Message& message: report) {
    switch (message.type) {
      case Type::Warning:
        os << fmt::format("Warning: {}\n", message);
        break;
      default:
        os << fmt::format("Error: {}\n", message);
        break;
    }
  }
  return os;
}